

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O2

int __thiscall
SatPos::CalculateClkDifdot
          (SatPos *this,Ephemeris *Eph,int prn,SATTIME tsv,NavSys sys,double *ClkDifdot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Satellite *pSVar5;
  double dVar6;
  
  *ClkDifdot = 0.0;
  pSVar5 = this->Bds;
  if (sys == GPS) {
    pSVar5 = this->Gps;
  }
  dVar1 = *(double *)(&DAT_0010f470 + (ulong)(sys == GPS) * 8);
  dVar2 = pSVar5[prn].Ekdot;
  dVar3 = Eph[prn].ecc;
  dVar4 = Eph[prn].sqrtA;
  dVar6 = cos(pSVar5[prn].Ek);
  *ClkDifdot = (tsv.SOW - Eph[prn].toc) * (Eph[prn].af2 + Eph[prn].af2) + Eph[prn].af1 +
               dVar6 * dVar1 * dVar3 * dVar4 * dVar2;
  return 0;
}

Assistant:

int SatPos::CalculateClkDifdot(const Ephemeris* Eph, const int prn, const SATTIME tsv,
                               const NavSys sys, double &ClkDifdot) {
    double F, Ek, Ekdot;
    ClkDifdot = 0;
    try
    {
        if(sys == GPS){
            F = -2 * sqrt(GPSMIU) / LIGHTSPEED / LIGHTSPEED;
            Ek = Gps[prn].Ek;
            Ekdot =  Gps[prn].Ekdot;
        }
        else if(sys == BDS){
            F = -2 * sqrt(BDSMIU) / LIGHTSPEED / LIGHTSPEED;
            Ek = Bds[prn].Ek;
            Ekdot = Bds[prn].Ekdot;
        }
    }
    catch(...)
    {
        cout << "error happened when calculation satellite clock difference" << endl;
        return UNKNOWN_ERROR;
    }
    double deltatr = F * Eph[prn].ecc * Eph[prn].sqrtA * cos(Ek) * Ekdot;
    SATTIME t_now = tsv;
    ClkDifdot = Eph[prn].af1 + 2 * Eph[prn].af2 * (t_now.SOW - Eph[prn].toc) + deltatr; 

    return 0;
}